

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

void __thiscall
HermiteSpline<5U,_2U>::walk
          (HermiteSpline<5U,_2U> *this,double deltatau,
          _func_void_VectorNd_HermiteSpline<5U,_2U>_ptr_double_Polynomial_ptr_void_ptr *fn,
          void *payload)

{
  code *pcVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  undefined8 in_RDX;
  code *in_RSI;
  vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_> *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  VectorNd pt;
  double reltau;
  int m;
  double tau;
  UnitBoundedPolynomial<5U,_2U> *in_stack_ffffffffffffffa8;
  Matrix<double,_2,_1,_0,_2,_1> local_48;
  double local_38;
  int local_2c;
  double local_28;
  undefined8 local_20;
  code *local_18;
  double local_10;
  
  local_28 = 0.0;
  local_2c = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  while (uVar2 = (ulong)local_2c,
        sVar3 = std::
                vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
                ::size(in_RDI), dVar5 = local_28, uVar2 < sVar3) {
    pvVar4 = std::
             vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
             ::operator[](in_RDI,(long)local_2c);
    local_38 = dVar5 / pvVar4->length;
    std::vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>::
    operator[](in_RDI,(long)local_2c);
    UnitBoundedPolynomial<5U,_2U>::interpolate(in_stack_ffffffffffffffa8,(double)in_RDI);
    pcVar1 = local_18;
    Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix
              ((Matrix<double,_2,_1,_0,_2,_1> *)&stack0xffffffffffffffa8,&local_48);
    dVar5 = local_38;
    pvVar4 = std::
             vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
             ::operator[](in_RDI,(long)local_2c);
    (*pcVar1)(dVar5,&stack0xffffffffffffffa8,in_RDI,pvVar4,local_20);
    dVar5 = local_10 + local_28;
    local_28 = dVar5;
    pvVar4 = std::
             vector<UnitBoundedPolynomial<5U,_2U>,_std::allocator<UnitBoundedPolynomial<5U,_2U>_>_>
             ::operator[](in_RDI,(long)local_2c);
    if (pvVar4->length <= dVar5 && dVar5 != pvVar4->length) {
      local_28 = 0.0;
      local_2c = local_2c + 1;
    }
  }
  return;
}

Assistant:

void HermiteSpline<Order, Dims>::walk(const double deltatau, void (*fn)(VectorNd, HermiteSpline<Order, Dims>&, double, UnitBoundedPolynomial<Order, Dims>&, void *), void *payload)
{
    double tau = 0.0;
    int m = 0;

    while (m < children.size())
    {
        double reltau = tau / children[m].length;
        VectorNd pt = children[m].interpolate(reltau);

        fn(pt, *this, reltau, children[m], payload);
        tau += deltatau;

        if (tau > children[m].length)
        {
            tau = 0.0;
            m++;
        }
    }
}